

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bios.h
# Opt level: O0

int bios_u32(envy_bios *bios,uint offs,uint32_t *res)

{
  uint32_t *res_local;
  uint offs_local;
  envy_bios *bios_local;
  
  if (offs + 3 < bios->length) {
    *res = CONCAT13(bios->data[offs + 3],
                    CONCAT12(bios->data[offs + 2],CONCAT11(bios->data[offs + 1],bios->data[offs])));
    bios_local._4_4_ = 0;
  }
  else {
    *res = 0;
    fprintf(_stderr,"requested OOB u32 at 0x%04x\n",(ulong)offs);
    bios_local._4_4_ = -0xe;
  }
  return bios_local._4_4_;
}

Assistant:

static inline int bios_u32(struct envy_bios *bios, unsigned int offs, uint32_t *res) {
	if (offs+3 >= bios->length) {
		*res = 0;
		ENVY_BIOS_ERR("requested OOB u32 at 0x%04x\n", offs);
		return -EFAULT;
	}
	*res = bios->data[offs] | bios->data[offs+1] << 8 | bios->data[offs+2] << 16 | bios->data[offs+3] << 24;
	return 0;
}